

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::BinaryExpr<const_type_&,_const_convert_c_&>::streamReconstructedExpression
          (BinaryExpr<const_type_&,_const_convert_c_&> *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  string *in_R9;
  StringRef op;
  ReusableStringStream local_70;
  string local_58;
  string local_38 [32];
  
  std::__cxx11::string::string(local_38,(string *)Detail::unprintableString_abi_cxx11_);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  ReusableStringStream::ReusableStringStream(&local_70);
  std::ostream::operator<<(local_70.m_oss,0);
  ReusableStringStream::str_abi_cxx11_(&local_58,&local_70);
  ReusableStringStream::~ReusableStringStream(&local_70);
  op.m_size = (size_type)&local_58;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)local_38,lhs,op,in_R9);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }